

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

string * __thiscall
chaiscript::exception::eval_error::format_detail_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this,
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_functions,bool t_dot_notation,Dispatch_Engine *t_ss)

{
  eval_error *peVar1;
  ostream *poVar2;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *t_function;
  eval_error *this_00;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if (*(long *)&this->field_0x8 - (long)*(long **)this == 0x10) {
    if (**(long **)this == 0) {
      __assert_fail("t_functions[0]",
                    "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/chaiscript_common.hpp"
                    ,0x1d4,
                    "static std::string chaiscript::exception::eval_error::format_detail(const std::vector<chaiscript::Const_Proxy_Function> &, bool, const chaiscript::detail::Dispatch_Engine &)"
                   );
    }
    poVar2 = std::operator<<(local_1a8,"  Expected: ");
    format_types_abi_cxx11_
              (&local_1d8,*(eval_error **)this,(Const_Proxy_Function *)((ulong)t_functions & 0xff),
               t_dot_notation,t_ss);
    poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  else {
    poVar2 = std::operator<<(local_1a8,"  ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2," overloads available:\n");
    peVar1 = *(eval_error **)&this->field_0x8;
    for (this_00 = *(eval_error **)this; this_00 != peVar1; this_00 = (eval_error *)&this_00->reason
        ) {
      poVar2 = std::operator<<(local_1a8,"      ");
      format_types_abi_cxx11_
                (&local_1d8,this_00,(Const_Proxy_Function *)((ulong)t_functions & 0xff),
                 t_dot_notation,t_ss);
      poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
      std::operator<<(poVar2,'\n');
      std::__cxx11::string::~string((string *)&local_1d8);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

static std::string format_detail(const std::vector<chaiscript::Const_Proxy_Function> &t_functions,
                                       bool t_dot_notation,
                                       const chaiscript::detail::Dispatch_Engine &t_ss) {
        std::stringstream ss;
        if (t_functions.size() == 1) {
          assert(t_functions[0]);
          ss << "  Expected: " << format_types(t_functions[0], t_dot_notation, t_ss) << '\n';
        } else {
          ss << "  " << t_functions.size() << " overloads available:\n";

          for (const auto &t_function : t_functions) {
            ss << "      " << format_types((t_function), t_dot_notation, t_ss) << '\n';
          }
        }

        return ss.str();
      }